

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O3

void __thiscall
chaiscript::exception::load_module_error::load_module_error
          (load_module_error *this,string *t_name,
          vector<chaiscript::exception::load_module_error,_std::allocator<chaiscript::exception::load_module_error>_>
          *t_errors)

{
  string local_30;
  
  format_error(&local_30,t_name,t_errors);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)this = &PTR__runtime_error_003d2788;
  return;
}

Assistant:

load_module_error(const std::string &t_name, const std::vector<load_module_error> &t_errors)
          : std::runtime_error(format_error(t_name, t_errors)) {
      }